

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int32_t iVar4;
  size_type sVar5;
  const_reference pvVar6;
  ostream *poVar7;
  element_type *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int32_t labelId;
  shared_ptr<const_fasttext::Dictionary> dict;
  anon_class_1_0_00000001 writeMetric;
  ifstream ifs;
  Meter meter;
  FastText fasttext;
  real threshold;
  int32_t k;
  value_type *input;
  value_type *model;
  bool perLabel;
  undefined4 in_stack_fffffffffffffb88;
  int32_t in_stack_fffffffffffffb8c;
  Meter *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined1 falseNegativeLabels;
  Meter *in_stack_fffffffffffffba0;
  int32_t k_00;
  ostream *in_stack_fffffffffffffba8;
  Meter *in_stack_fffffffffffffbb0;
  FastText *in_stack_fffffffffffffbc0;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffbd0;
  int iVar8;
  string local_3f0 [4];
  int32_t in_stack_fffffffffffffc14;
  Dictionary *in_stack_fffffffffffffc18;
  ostream local_3c9;
  string local_3c8 [32];
  Meter *in_stack_fffffffffffffc58;
  real in_stack_fffffffffffffc60;
  int32_t in_stack_fffffffffffffc64;
  istream *in_stack_fffffffffffffc68;
  FastText *in_stack_fffffffffffffc70;
  allocator<char> local_379;
  string local_378 [36];
  int local_354;
  int local_33c;
  undefined1 local_338 [336];
  string *in_stack_fffffffffffffe18;
  FastText *in_stack_fffffffffffffe20;
  
  falseNegativeLabels = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDI,1);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb90,
                          (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if ((3 < sVar5) &&
     (sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), sVar5 < 7)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,2);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDI,3);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (4 < sVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,4);
      std::__cxx11::stoi((string *)in_stack_fffffffffffffb90,
                         (size_t *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),0);
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (5 < sVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,5);
      std::__cxx11::stof((string *)in_stack_fffffffffffffb90,
                         (size_t *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
    ::fasttext::FastText::FastText(in_stack_fffffffffffffbc0);
    ::fasttext::FastText::loadModel(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    ::fasttext::Meter::Meter(in_stack_fffffffffffffba0,(bool)falseNegativeLabels);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar2) {
      ::fasttext::FastText::test
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
                 in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    else {
      std::ifstream::ifstream(local_338,(string *)pvVar6,_S_in);
      bVar3 = std::ifstream::is_open();
      if ((bVar3 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      ::fasttext::FastText::test
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
                 in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::ifstream::~ifstream(local_338);
    }
    k_00 = (int32_t)((ulong)in_stack_fffffffffffffba0 >> 0x20);
    if (bVar1) {
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
      local_33c = (int)std::setprecision(6);
      std::operator<<(poVar7,(_Setprecision)local_33c);
      ::fasttext::FastText::getDictionary
                ((FastText *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_354 = 0;
      while( true ) {
        k_00 = (int32_t)((ulong)in_stack_fffffffffffffba0 >> 0x20);
        iVar8 = local_354;
        this = std::
               __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x170820);
        iVar4 = ::fasttext::Dictionary::nlabels(this);
        if (iVar4 <= iVar8) break;
        __s = &local_379;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar8,in_stack_fffffffffffffbd0),(char *)__s,
                   (allocator<char> *)in_stack_fffffffffffffbc0);
        in_stack_fffffffffffffbc0 =
             (FastText *)
             ::fasttext::Meter::f1Score(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffb90,
                   (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   7.45810866891904e-318);
        std::__cxx11::string::~string(local_378);
        std::allocator<char>::~allocator(&local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar8,in_stack_fffffffffffffbd0),(char *)__s,
                   (allocator<char> *)in_stack_fffffffffffffbc0);
        in_stack_fffffffffffffbb0 =
             (Meter *)::fasttext::Meter::precision
                                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffb90,
                   (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   7.45874107294571e-318);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc5f);
        in_stack_fffffffffffffba8 = &local_3c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar8,in_stack_fffffffffffffbd0),(char *)__s,
                   (allocator<char> *)in_stack_fffffffffffffbc0);
        in_stack_fffffffffffffba0 =
             (Meter *)::fasttext::Meter::recall(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c)
        ;
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffb90,
                   (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   7.45937347697239e-318);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        poVar7 = std::operator<<((ostream *)&std::cout," ");
        std::
        __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1709e5);
        ::fasttext::Dictionary::getLabel_abi_cxx11_
                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
        in_stack_fffffffffffffb90 = (Meter *)std::operator<<(poVar7,local_3f0);
        std::ostream::operator<<(in_stack_fffffffffffffb90,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_3f0);
        local_354 = local_354 + 1;
      }
      std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
                ((shared_ptr<const_fasttext::Dictionary> *)0x170b6b);
    }
    ::fasttext::Meter::writeGeneralMetrics(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,k_00)
    ;
    exit(0);
  }
  if (bVar1) {
    printTestLabelUsage();
  }
  else {
    printTestUsage();
  }
  exit(1);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter(false);

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}